

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O1

Int __thiscall Json::Value::asInt(Value *this)

{
  double dVar1;
  bool bVar2;
  uint uVar3;
  char *extraout_RAX;
  char *pcVar4;
  undefined8 extraout_RAX_00;
  long val;
  ostringstream oss;
  string local_1b0;
  char *local_190;
  ValueHolder local_188 [2];
  char local_178 [96];
  ios_base local_118 [264];
  
  uVar3 = (uint)(byte)this->field_0x8;
  switch(this->field_0x8) {
  case 0:
    goto switchD_0014135b_caseD_0;
  case 1:
  case 3:
    bVar2 = isInt(this);
    if (!bVar2) {
      this = (Value *)local_188;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)this);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this,"LargestInt out of Int range",0x1b);
      std::__cxx11::stringbuf::str();
      throwLogicError(&local_1b0);
      goto switchD_0014135b_caseD_2;
    }
    break;
  case 2:
switchD_0014135b_caseD_2:
    bVar2 = isInt(this);
    if (!bVar2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_188[0].bool_);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_188[0].bool_,"LargestUInt out of Int range",0x1c);
      std::__cxx11::stringbuf::str();
      throwLogicError(&local_1b0);
      goto LAB_001414a8;
    }
    break;
  case 4:
    dVar1 = (this->value_).real_;
    if ((-2147483648.0 <= dVar1) && (dVar1 <= 2147483647.0)) {
      return (int)dVar1;
    }
LAB_001414a8:
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_188[0].bool_);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_188[0].bool_,"double out of Int range",0x17);
    std::__cxx11::stringbuf::str();
    throwLogicError(&local_1b0);
LAB_001414e2:
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_188[0].bool_);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_188[0].bool_,"LargestInt out of Int range",0x1b);
    std::__cxx11::stringbuf::str();
    throwLogicError(&local_1b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
      operator_delete(local_1b0._M_dataplus._M_p);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_188[0].bool_);
    std::ios_base::~ios_base(local_118);
    _Unwind_Resume(extraout_RAX_00);
  case 5:
    asString_abi_cxx11_((string *)local_188,this);
    bVar2 = converToInt(local_188[0].string_,(long *)&local_190);
    pcVar4 = local_178;
    if (local_188[0] != pcVar4) {
      operator_delete(local_188[0].string_);
      pcVar4 = extraout_RAX;
    }
    if ((bVar2) && (pcVar4 = local_190, (char *)(long)(int)local_190 != local_190))
    goto LAB_001414e2;
    if (bVar2) {
      return (Int)pcVar4;
    }
  default:
    this = (Value *)local_188;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)this);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this,"Value is not convertible to Int.",0x20);
    std::__cxx11::stringbuf::str();
    throwLogicError(&local_1b0);
switchD_0014135b_caseD_6:
    return (uint)(byte)*(ostringstream *)this;
  case 6:
    goto switchD_0014135b_caseD_6;
  }
  uVar3 = *(uint *)this;
switchD_0014135b_caseD_0:
  return uVar3;
}

Assistant:

Value::Int Value::asInt() const {
  switch (type_) {
#if defined(JSON_HAS_INT64)
  case int64Value:
#endif
  case intValue:
    JSON_ASSERT_MESSAGE(isInt(), "LargestInt out of Int range");
    return Int(value_.int_);
  case uintValue:
    JSON_ASSERT_MESSAGE(isInt(), "LargestUInt out of Int range");
    return Int(value_.uint_);
  case realValue:
    JSON_ASSERT_MESSAGE(InRange(value_.real_, minInt, maxInt),
                        "double out of Int range");
    return Int(value_.real_);
  case nullValue:
    return 0;
  case booleanValue:
    return value_.bool_ ? 1 : 0;
  case stringValue: {
    long int val;

    if (!converToInt (asString().c_str(), &val)) {
      break;
    }

    JSON_ASSERT_MESSAGE(IsInRange (val, minInt, maxInt),
                        "LargestInt out of Int range");
    return Int(val);
  }
  default:
    break;
  }
  JSON_FAIL_MESSAGE("Value is not convertible to Int.");
}